

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation.cc
# Opt level: O3

int webrtc::WebRtcAec_GetMetrics(void *handle,AecMetrics *metrics)

{
  int iVar1;
  Aec *self;
  uint uVar2;
  uint uVar3;
  Stats a_nlp;
  Stats erle;
  Stats erl;
  Stats local_b0;
  Stats local_80;
  Stats local_50;
  
  if (handle != (void *)0x0) {
    if (metrics == (AecMetrics *)0x0) {
      iVar1 = 0x2ee3;
    }
    else {
      iVar1 = 0x2ee2;
      if (*(short *)((long)handle + 0x24) == 0x2a) {
        WebRtcAec_GetEchoStats
                  (*(AecCore **)((long)handle + 0x70),&local_50,&local_80,&local_b0,
                   &metrics->divergent_filter_fraction);
        (metrics->erl).instant = (int)local_50.instant;
        (metrics->erl).max = (int)local_50.max;
        iVar1 = (int)local_50.min;
        if (100.0 <= local_50.min) {
          iVar1 = -100;
        }
        (metrics->erl).min = iVar1;
        (metrics->erle).instant = (int)local_80.instant;
        uVar2 = -(uint)(-100.0 < local_80.himean && -100.0 < local_80.average);
        uVar3 = -(uint)(-100.0 < local_50.himean && -100.0 < local_50.average);
        uVar2 = ~uVar2 & 0xffffff9c |
                (int)(local_80.himean * (float)0x3f333333 + local_80.average * 0.3) & uVar2;
        uVar3 = ~uVar3 & 0xffffff9c |
                (int)(local_50.himean * (float)0x3f333333 + local_50.average * 0.3) & uVar3;
        (metrics->erl).average = uVar3;
        (metrics->erle).average = uVar2;
        (metrics->erle).max = (int)local_80.max;
        iVar1 = (int)local_80.min;
        if (100.0 <= local_80.min) {
          iVar1 = -100;
        }
        (metrics->erle).min = iVar1;
        iVar1 = uVar2 + uVar3;
        if ((int)uVar2 < -99) {
          iVar1 = -100;
        }
        if ((int)uVar3 < -99) {
          iVar1 = -100;
        }
        (metrics->rerl).instant = iVar1;
        (metrics->rerl).average = iVar1;
        (metrics->rerl).max = iVar1;
        (metrics->rerl).min = iVar1;
        (metrics->aNlp).instant = (int)local_b0.instant;
        iVar1 = (int)(local_b0.himean * 0.7 + local_b0.average * 0.3);
        if (local_b0.average <= -100.0 || local_b0.himean <= -100.0) {
          iVar1 = -100;
        }
        (metrics->aNlp).average = iVar1;
        (metrics->aNlp).max = (int)local_b0.max;
        iVar1 = (int)local_b0.min;
        if (100.0 <= local_b0.min) {
          iVar1 = -100;
        }
        (metrics->aNlp).min = iVar1;
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int WebRtcAec_GetMetrics(void* handle, AecMetrics* metrics) {
  const float kUpWeight = 0.7f;
  float dtmp;
  int stmp;
  Aec* self = reinterpret_cast<Aec*>(handle);
  Stats erl;
  Stats erle;
  Stats a_nlp;

  if (handle == NULL) {
    return -1;
  }
  if (metrics == NULL) {
    return AEC_NULL_POINTER_ERROR;
  }
  if (self->initFlag != initCheck) {
    return AEC_UNINITIALIZED_ERROR;
  }

  WebRtcAec_GetEchoStats(self->aec, &erl, &erle, &a_nlp,
                         &metrics->divergent_filter_fraction);

  // ERL
  metrics->erl.instant = static_cast<int>(erl.instant);

  if ((erl.himean > kOffsetLevel) && (erl.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erl.himean + (1 - kUpWeight) * erl.average;
    metrics->erl.average = static_cast<int>(dtmp);
  } else {
    metrics->erl.average = kOffsetLevel;
  }

  metrics->erl.max = static_cast<int>(erl.max);

  if (erl.min < (kOffsetLevel * (-1))) {
    metrics->erl.min = static_cast<int>(erl.min);
  } else {
    metrics->erl.min = kOffsetLevel;
  }

  // ERLE
  metrics->erle.instant = static_cast<int>(erle.instant);

  if ((erle.himean > kOffsetLevel) && (erle.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * erle.himean + (1 - kUpWeight) * erle.average;
    metrics->erle.average = static_cast<int>(dtmp);
  } else {
    metrics->erle.average = kOffsetLevel;
  }

  metrics->erle.max = static_cast<int>(erle.max);

  if (erle.min < (kOffsetLevel * (-1))) {
    metrics->erle.min = static_cast<int>(erle.min);
  } else {
    metrics->erle.min = kOffsetLevel;
  }

  // RERL
  if ((metrics->erl.average > kOffsetLevel) &&
      (metrics->erle.average > kOffsetLevel)) {
    stmp = metrics->erl.average + metrics->erle.average;
  } else {
    stmp = kOffsetLevel;
  }
  metrics->rerl.average = stmp;

  // No other statistics needed, but returned for completeness.
  metrics->rerl.instant = stmp;
  metrics->rerl.max = stmp;
  metrics->rerl.min = stmp;

  // A_NLP
  metrics->aNlp.instant = static_cast<int>(a_nlp.instant);

  if ((a_nlp.himean > kOffsetLevel) && (a_nlp.average > kOffsetLevel)) {
    // Use a mix between regular average and upper part average.
    dtmp = kUpWeight * a_nlp.himean + (1 - kUpWeight) * a_nlp.average;
    metrics->aNlp.average = static_cast<int>(dtmp);
  } else {
    metrics->aNlp.average = kOffsetLevel;
  }

  metrics->aNlp.max = static_cast<int>(a_nlp.max);

  if (a_nlp.min < (kOffsetLevel * (-1))) {
    metrics->aNlp.min = static_cast<int>(a_nlp.min);
  } else {
    metrics->aNlp.min = kOffsetLevel;
  }

  return 0;
}